

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  bool opt;
  char *pcVar2;
  
  if (argc != 3) {
    pcVar2 = "Usage: ./compile_test /path_to_source_code -use_mode";
LAB_0013071a:
    poVar1 = std::operator<<((ostream *)&std::cerr,pcVar2);
LAB_0013071f:
    std::endl<char,std::char_traits<char>>(poVar1);
    return -1;
  }
  if (*argv[2] != '-') {
    pcVar2 = "please \'-\' + option";
    goto LAB_0013071a;
  }
  switch(argv[2][1]) {
  case '1':
    TestLexicalAnalysis(argv[1]);
    break;
  case '2':
    TestGrammaAnalysis(argv[1]);
    break;
  case '3':
    TestSemanticAnalysis(argv[1]);
    break;
  case '4':
    pcVar2 = argv[1];
    opt = false;
    goto LAB_0013074c;
  case '5':
    pcVar2 = argv[1];
    opt = true;
LAB_0013074c:
    TestGenerate(pcVar2,opt,false);
    return 0;
  case '6':
    TestGenerate(argv[1],true,true);
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cerr,"invalid option: ");
    poVar1 = std::operator<<(poVar1,argv[2][1]);
    goto LAB_0013071f;
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    if (argc != 3) {
        std::cerr << "Usage: ./compile_test /path_to_source_code -use_mode" << endl;
        return -1;
    } else {
        for (int i=2; i<3; ++i) {
            if (argv[i][0] == '-') {
                switch(argv[i][1]) {
                    case '1': TestLexicalAnalysis(argv[1]); break;
                    case '2': TestGrammaAnalysis(argv[1]); break;
                    case '3': TestSemanticAnalysis(argv[1]); break;
                    case '4': TestGenerate(argv[1], false, false); break;
                    case '5': TestGenerate(argv[1], true, false); break;
                    case '6': TestGenerate(argv[1], true, true); break;
                    default: {
                        std::cerr << "invalid option: " << argv[i][1] << endl;
                        return -1;
                    }
                }
            } else {
                std::cerr << "please '-' + option" << endl;
                return -1;
            }
        }
    }
    return 0;
}